

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateRow(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int r,int lv,int prow,int pcol,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *pval,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  fpclass_type fVar5;
  fpclass_type fVar6;
  int *piVar7;
  pointer pnVar8;
  undefined8 uVar9;
  int32_t iVar14;
  undefined8 uVar10;
  int32_t iVar15;
  Pring *pPVar11;
  Pring *pPVar12;
  Pring *pPVar13;
  int32_t iVar16;
  fpclass_type fVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int *piVar22;
  int *piVar23;
  cpp_dec_float<200U,_int,_void> *pcVar24;
  pointer pnVar25;
  cpp_dec_float<200U,_int,_void> *pcVar26;
  uint *puVar27;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar28;
  undefined4 *puVar29;
  cpp_dec_float<200U,_int,_void> *pcVar30;
  pointer pnVar31;
  uint *puVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  byte bVar36;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_358;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [13];
  undefined3 uStack_2bb;
  int iStack_2b8;
  bool bStack_2b4;
  undefined8 local_2b0;
  long local_2a0;
  undefined1 local_298 [32];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [13];
  undefined3 uStack_22b;
  int iStack_228;
  bool bStack_224;
  undefined8 local_220;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  cpp_dec_float<200U,_int,_void> local_19c;
  cpp_dec_float<200U,_int,_void> local_11c;
  uint local_9c [27];
  
  bVar36 = 0;
  local_1b8 = (undefined1  [16])0x0;
  local_1c8 = (undefined1  [16])0x0;
  local_1d8 = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_1f8 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  local_218 = (undefined1  [16])0x0;
  local_220._0_4_ = cpp_dec_float_finite;
  local_220._4_4_ = 0x1c;
  local_298._0_16_ = (undefined1  [16])0x0;
  local_298._16_16_ = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_258 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_238 = SUB1613((undefined1  [16])0x0,0);
  uStack_22b = 0;
  iStack_228 = 0;
  bStack_224 = false;
  piVar7 = (this->u).row.len;
  iVar3 = (this->u).row.start[r];
  iVar4 = piVar7[r];
  piVar7[r] = iVar4 + -1;
  local_358 = iVar4 + -1 + iVar3;
  lVar33 = (long)local_358;
  lVar19 = lVar33 * 0x80 + 0x80;
  lVar20 = lVar33 * 4;
  do {
    lVar35 = lVar20;
    lVar21 = lVar19;
    lVar19 = lVar21 + -0x80;
    lVar20 = lVar35 + -4;
  } while (*(int *)((long)(this->u).row.idx + lVar35) != pcol);
  local_2b0._0_4_ = cpp_dec_float_finite;
  local_2b0._4_4_ = 0x1c;
  local_328 = (undefined1  [16])0x0;
  local_318 = (undefined1  [16])0x0;
  local_308 = (undefined1  [16])0x0;
  local_2f8 = (undefined1  [16])0x0;
  local_2e8 = (undefined1  [16])0x0;
  local_2d8 = (undefined1  [16])0x0;
  local_2c8 = SUB1613((undefined1  [16])0x0,0);
  uStack_2bb = 0;
  iStack_2b8 = 0;
  bStack_2b4 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_328,
             (cpp_dec_float<200U,_int,_void> *)
             ((long)(this->u).row.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems + lVar21),
             &pval->m_backend);
  pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_328;
  puVar27 = (uint *)local_298;
  for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
    *puVar27 = (pcVar26->data)._M_elems[0];
    pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar36 * -8 + 4);
    puVar27 = puVar27 + (ulong)bVar36 * -2 + 1;
  }
  iStack_228 = iStack_2b8;
  bStack_224 = bStack_2b4;
  local_220._0_4_ = (fpclass_type)local_2b0;
  local_220._4_4_ = local_2b0._4_4_;
  pnVar8 = (this->l).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar27 = (uint *)local_298;
  pnVar25 = pnVar8 + lv;
  for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
    (pnVar25->m_backend).data._M_elems[0] = *puVar27;
    puVar27 = puVar27 + (ulong)bVar36 * -2 + 1;
    pnVar25 = (pointer)((long)pnVar25 + ((ulong)bVar36 * -2 + 1) * 4);
  }
  pnVar8[lv].m_backend.exp = iStack_2b8;
  pnVar8[lv].m_backend.neg = bStack_2b4;
  pnVar8[lv].m_backend.fpclass = (fpclass_type)local_2b0;
  pnVar8[lv].m_backend.prec_elem = local_2b0._4_4_;
  (this->l).idx[lv] = r;
  piVar7 = (this->u).row.idx;
  *(int *)((long)piVar7 + lVar35) = piVar7[local_358];
  pnVar8 = (this->u).row.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar25 = pnVar8 + local_358;
  puVar29 = (undefined4 *)((long)pnVar8[-1].m_backend.data._M_elems + lVar21);
  for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
    *puVar29 = (pnVar25->m_backend).data._M_elems[0];
    pnVar25 = (pointer)((long)pnVar25 + ((ulong)bVar36 * -2 + 1) * 4);
    puVar29 = puVar29 + (ulong)bVar36 * -2 + 1;
  }
  *(int *)((long)(&pnVar8[-1].m_backend.data + 1) + lVar21) = pnVar8[local_358].m_backend.exp;
  *(bool *)((long)(&pnVar8[-1].m_backend.data + 1) + 4U + lVar21) = pnVar8[local_358].m_backend.neg;
  *(undefined8 *)((long)(&pnVar8[-1].m_backend.data + 1) + 8U + lVar21) =
       *(undefined8 *)&pnVar8[local_358].m_backend.fpclass;
  iVar34 = (this->u).row.len[prow];
  local_2a0 = (long)prow;
  if (1 < iVar4) {
    do {
      piVar7 = (this->temp).s_mark;
      iVar4 = (this->u).row.idx[lVar33 + -1];
      lVar33 = lVar33 + -1;
      if (piVar7[iVar4] != 0) {
        piVar7[iVar4] = 0;
        pcVar26 = &this->work[iVar4].m_backend;
        local_2b0._0_4_ = cpp_dec_float_finite;
        local_2b0._4_4_ = 0x1c;
        local_328 = (undefined1  [16])0x0;
        local_318 = (undefined1  [16])0x0;
        local_308 = (undefined1  [16])0x0;
        local_2f8 = (undefined1  [16])0x0;
        local_2e8 = (undefined1  [16])0x0;
        local_2d8 = (undefined1  [16])0x0;
        local_2c8 = SUB1613((undefined1  [16])0x0,0);
        uStack_2bb = 0;
        iStack_2b8 = 0;
        bStack_2b4 = false;
        if ((cpp_dec_float<200U,_int,_void> *)local_328 != pcVar26) {
          pcVar24 = pcVar26;
          pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_328;
          for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
            (pcVar30->data)._M_elems[0] =
                 (((cpp_dec_float<200U,_int,_void> *)&pcVar24->data)->data)._M_elems[0];
            pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar36 * -8 + 4);
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar36 * -8 + 4);
          }
          iStack_2b8 = pcVar26->exp;
          bStack_2b4 = pcVar26->neg;
          local_2b0._0_4_ = pcVar26->fpclass;
          local_2b0._4_4_ = pcVar26->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_328,
                   (cpp_dec_float<200U,_int,_void> *)local_298);
        pnVar8 = (this->u).row.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&pnVar8[lVar33].m_backend,(cpp_dec_float<200U,_int,_void> *)local_328);
        pcVar26 = &pnVar8[lVar33].m_backend;
        puVar27 = (uint *)local_218;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          *puVar27 = (pcVar26->data)._M_elems[0];
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar36 * -8 + 4);
          puVar27 = puVar27 + (ulong)bVar36 * -2 + 1;
        }
        iVar18 = pnVar8[lVar33].m_backend.exp;
        bVar2 = pnVar8[lVar33].m_backend.neg;
        uVar9._0_4_ = pnVar8[lVar33].m_backend.fpclass;
        uVar9._4_4_ = pnVar8[lVar33].m_backend.prec_elem;
        puVar27 = (uint *)local_218;
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_328;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pcVar26->data)._M_elems[0] = *puVar27;
          puVar27 = puVar27 + (ulong)bVar36 * -2 + 1;
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar36 * -8 + 4);
        }
        pnVar28 = eps;
        pcVar26 = &local_11c;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pcVar26->data)._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
          pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar28 + ((ulong)bVar36 * -2 + 1) * 4);
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + ((ulong)bVar36 * -2 + 1) * 4)
          ;
        }
        local_11c.exp = (eps->m_backend).exp;
        local_11c.neg = (eps->m_backend).neg;
        fVar5 = (eps->m_backend).fpclass;
        iVar14 = (eps->m_backend).prec_elem;
        local_11c.fpclass = fVar5;
        local_11c.prec_elem = iVar14;
        bStack_2b4 = bVar2;
        if ((bVar2 == true) && (local_328._0_4_ != 0 || (fpclass_type)uVar9 != cpp_dec_float_finite)
           ) {
          bStack_2b4 = false;
        }
        iVar34 = iVar34 + -1;
        iStack_2b8 = iVar18;
        local_2b0 = uVar9;
        if ((fVar5 != cpp_dec_float_NaN && (fpclass_type)uVar9 != cpp_dec_float_NaN) &&
           (iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_328,&local_11c), iVar18 < 1)
           ) {
          piVar7 = (this->u).row.len + r;
          *piVar7 = *piVar7 + -1;
          lVar19 = (long)local_358 + -1;
          pnVar8 = (this->u).row.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar25 = pnVar8 + lVar19;
          pnVar31 = pnVar8 + lVar33;
          for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
            (pnVar31->m_backend).data._M_elems[0] = (pnVar25->m_backend).data._M_elems[0];
            pnVar25 = (pointer)((long)pnVar25 + ((ulong)bVar36 * -2 + 1) * 4);
            pnVar31 = (pointer)((long)pnVar31 + ((ulong)bVar36 * -2 + 1) * 4);
          }
          pnVar8[lVar33].m_backend.exp = pnVar8[lVar19].m_backend.exp;
          pnVar8[lVar33].m_backend.neg = pnVar8[lVar19].m_backend.neg;
          iVar16 = pnVar8[lVar19].m_backend.prec_elem;
          pnVar8[lVar33].m_backend.fpclass = pnVar8[lVar19].m_backend.fpclass;
          pnVar8[lVar33].m_backend.prec_elem = iVar16;
          piVar7 = (this->u).row.idx;
          piVar7[lVar33] = piVar7[(long)local_358 + -1];
          piVar7 = (this->temp).s_cact + iVar4;
          *piVar7 = *piVar7 + -1;
          local_358 = local_358 + -1;
          piVar7 = (this->u).col.len;
          iVar18 = piVar7[iVar4] + -1;
          piVar7[iVar4] = iVar18;
          piVar7 = (this->u).col.idx;
          lVar19 = (long)(iVar18 + (this->u).col.start[iVar4]);
          piVar22 = piVar7 + lVar19 + 1;
          do {
            piVar23 = piVar22 + -1;
            piVar1 = piVar22 + -1;
            piVar22 = piVar23;
          } while (*piVar1 != r);
          *piVar23 = piVar7[lVar19];
        }
      }
    } while (iVar3 < lVar33);
  }
  local_358 = (this->u).row.len[r];
  iVar34 = iVar34 + local_358;
  if ((this->u).row.max[r] < iVar34) {
    remaxRow(this,r,iVar34);
  }
  lVar19 = (long)(this->u).row.len[local_2a0];
  if (0 < lVar19) {
    piVar7 = (this->u).row.start;
    lVar20 = (long)piVar7[local_2a0];
    local_358 = local_358 + piVar7[r];
    lVar19 = lVar19 + lVar20;
    do {
      piVar7 = (this->temp).s_mark;
      iVar3 = (this->u).row.idx[lVar20];
      if (piVar7[iVar3] == 0) {
        piVar7[iVar3] = 1;
      }
      else {
        pnVar28 = this->work + iVar3;
        local_328._0_4_ = (pnVar28->m_backend).data._M_elems[0];
        puVar27 = (pnVar28->m_backend).data._M_elems + 1;
        puVar32 = local_9c;
        for (lVar33 = 0x1b; lVar33 != 0; lVar33 = lVar33 + -1) {
          *puVar32 = *puVar27;
          puVar27 = puVar27 + (ulong)bVar36 * -2 + 1;
          puVar32 = puVar32 + (ulong)bVar36 * -2 + 1;
        }
        iVar4 = (pnVar28->m_backend).exp;
        uVar10._0_4_ = (pnVar28->m_backend).fpclass;
        uVar10._4_4_ = (pnVar28->m_backend).prec_elem;
        bVar2 = (pnVar28->m_backend).neg;
        local_2b0._0_4_ = cpp_dec_float_finite;
        local_2b0._4_4_ = 0x1c;
        local_318 = (undefined1  [16])0x0;
        local_308 = (undefined1  [16])0x0;
        local_2f8 = (undefined1  [16])0x0;
        local_2e8 = (undefined1  [16])0x0;
        local_2d8 = (undefined1  [16])0x0;
        local_2c8 = SUB1613((undefined1  [16])0x0,0);
        uStack_2bb = 0;
        iStack_2b8 = 0;
        bStack_2b4 = false;
        local_328._4_12_ = SUB1612((undefined1  [16])0x0,4);
        puVar27 = local_9c;
        puVar32 = (uint *)(local_328 + 4);
        for (lVar33 = 0x1b; lVar33 != 0; lVar33 = lVar33 + -1) {
          *puVar32 = *puVar27;
          puVar27 = puVar27 + (ulong)bVar36 * -2 + 1;
          puVar32 = puVar32 + (ulong)bVar36 * -2 + 1;
        }
        iStack_2b8 = iVar4;
        bStack_2b4 = (bool)((local_328._0_4_ != 0 || (fpclass_type)uVar10 != cpp_dec_float_finite) ^
                           bVar2);
        local_2b0 = uVar10;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_328,
                   (cpp_dec_float<200U,_int,_void> *)local_298);
        bVar2 = bStack_2b4;
        iVar4 = iStack_2b8;
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_328;
        puVar27 = (uint *)local_218;
        for (lVar33 = 0x1c; lVar33 != 0; lVar33 = lVar33 + -1) {
          *puVar27 = (pcVar26->data)._M_elems[0];
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar36 * -8 + 4);
          puVar27 = puVar27 + (ulong)bVar36 * -2 + 1;
        }
        fVar17 = (fpclass_type)local_2b0;
        iVar16 = local_2b0._4_4_;
        puVar27 = (uint *)local_218;
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_328;
        for (lVar33 = 0x1c; lVar33 != 0; lVar33 = lVar33 + -1) {
          (pcVar26->data)._M_elems[0] = *puVar27;
          puVar27 = puVar27 + (ulong)bVar36 * -2 + 1;
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar36 * -8 + 4);
        }
        pnVar28 = eps;
        pcVar26 = &local_19c;
        for (lVar33 = 0x1c; lVar33 != 0; lVar33 = lVar33 + -1) {
          (pcVar26->data)._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
          pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar28 + ((ulong)bVar36 * -2 + 1) * 4);
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + ((ulong)bVar36 * -2 + 1) * 4)
          ;
        }
        local_19c.exp = (eps->m_backend).exp;
        local_19c.neg = (eps->m_backend).neg;
        fVar6 = (eps->m_backend).fpclass;
        iVar15 = (eps->m_backend).prec_elem;
        local_19c.fpclass = fVar6;
        local_19c.prec_elem = iVar15;
        if ((bStack_2b4 == true) &&
           (local_328._0_4_ != 0 || (fpclass_type)local_2b0 != cpp_dec_float_finite)) {
          bStack_2b4 = false;
        }
        if ((fVar6 != cpp_dec_float_NaN && (fpclass_type)local_2b0 != cpp_dec_float_NaN) &&
           (iVar34 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_328,&local_19c), 0 < iVar34)
           ) {
          lVar33 = (long)local_358;
          pnVar8 = (this->u).row.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar29 = (undefined4 *)local_218;
          pnVar25 = pnVar8 + lVar33;
          for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
            (pnVar25->m_backend).data._M_elems[0] = *puVar29;
            puVar29 = puVar29 + (ulong)bVar36 * -2 + 1;
            pnVar25 = (pointer)((long)pnVar25 + ((ulong)bVar36 * -2 + 1) * 4);
          }
          pnVar8[lVar33].m_backend.exp = iVar4;
          pnVar8[lVar33].m_backend.neg = bVar2;
          pnVar8[lVar33].m_backend.fpclass = fVar17;
          pnVar8[lVar33].m_backend.prec_elem = iVar16;
          (this->u).row.idx[lVar33] = iVar3;
          piVar7 = (this->u).row.len + r;
          *piVar7 = *piVar7 + 1;
          iVar4 = (this->u).col.len[iVar3];
          if ((this->u).col.max[iVar3] <= iVar4) {
            remaxCol(this,iVar3,iVar4 + 1);
          }
          local_358 = local_358 + 1;
          piVar7 = (this->u).col.idx;
          iVar4 = (this->u).col.start[iVar3];
          piVar22 = (this->u).col.len;
          iVar34 = piVar22[iVar3];
          piVar22[iVar3] = iVar34 + 1;
          piVar7[(long)iVar4 + (long)iVar34] = r;
          piVar7 = (this->temp).s_cact + iVar3;
          *piVar7 = *piVar7 + 1;
        }
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < lVar19);
  }
  pPVar11 = (this->temp).pivot_row;
  pPVar12 = pPVar11[r].next;
  pPVar12->prev = pPVar11[r].prev;
  (pPVar11[r].prev)->next = pPVar12;
  pPVar12 = (this->temp).pivot_rowNZ;
  iVar3 = (this->u).row.len[r];
  pPVar13 = pPVar12[iVar3].next;
  pPVar11[r].next = pPVar13;
  pPVar13->prev = pPVar11 + r;
  pPVar11[r].prev = pPVar12 + iVar3;
  pPVar12[iVar3].next = pPVar11 + r;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (&(this->temp).s_max.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[r].m_backend,-1);
  return lv + 1;
}

Assistant:

int CLUFactor<R>::updateRow(int r,
                            int lv,
                            int prow,
                            int pcol,
                            R pval,
                            R eps)
{
   int fill;
   R x, lx;
   int c, i, j, k, ll, m, n;

   n = u.row.start[r];
   m = --(u.row.len[r]) + n;

   /*  compute L VectorBase<R> entry and
    *  and remove pivot column form row file
    */

   for(j = m; u.row.idx[j] != pcol; --j)
      ;

   lx = u.row.val[j] / pval;

   l.val[lv] = lx;

   l.idx[lv] = r;

   ++lv;

   u.row.idx[j] = u.row.idx[m];

   u.row.val[j] = u.row.val[m];


   /*  update loop (I) and
    *  computing expected fill
    */
   fill = u.row.len[prow];

   for(j = m - 1; j >= n; --j)
   {
      c = u.row.idx[j];

      if(temp.s_mark[c])
      {
         /*  count fill elements.
          */
         temp.s_mark[c] = 0;
         --fill;

         /*  update row values
          */
         x = u.row.val[j] -= work[c] * lx;

         if(isZero(x, eps))
         {
            /* Eliminate zero from row r
             */
            --u.row.len[r];
            --m;
            u.row.val[j] = u.row.val[m];
            u.row.idx[j] = u.row.idx[m];

            /* Eliminate zero from column c
             */
            --(temp.s_cact[c]);
            k = --(u.col.len[c]) + u.col.start[c];

            for(i = k; u.col.idx[i] != r; --i)
               ;

            u.col.idx[i] = u.col.idx[k];
         }
      }
   }


   /*  create space for fill in row file
    */
   ll = u.row.len[r];

   if(ll + fill > u.row.max[r])
      remaxRow(r, ll + fill);

   ll += u.row.start[r];

   /*  fill creating update loop (II)
    */
   for(j = u.row.start[prow], m = j + u.row.len[prow]; j < m; ++j)
   {
      c = u.row.idx[j];

      if(temp.s_mark[c])
      {
         x = - work[c] * lx;

         if(isNotZero(x, eps))
         {
            /* produce fill element in row r
             */
            u.row.val[ll] = x;
            u.row.idx[ll] = c;
            ll++;
            u.row.len[r]++;

            /* produce fill element in column c
             */

            if(u.col.len[c] >= u.col.max[c])
               remaxCol(c, u.col.len[c] + 1);

            u.col.idx[u.col.start[c] + (u.col.len[c])++] = r;

            temp.s_cact[c]++;
         }
      }
      else
         temp.s_mark[c] = 1;
   }

   /*  move row to appropriate list.
    */
   removeDR(temp.pivot_row[r]);

   init2DR(temp.pivot_row[r], temp.pivot_rowNZ[u.row.len[r]]);

   assert(row.perm[r] < 0);

   temp.s_max[r] = -1;

   return lv;
}